

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O1

void __thiscall
MinVR::VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1>::VRDatumSpecialized
          (VRDatumSpecialized<int,_(MinVR::VRCORETYPE_ID)1> *this,int inVal)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  VRDatum::VRDatum(&this->super_VRDatum,VRCORETYPE_INT);
  (this->super_VRDatum)._vptr_VRDatum = (_func_int **)&PTR__VRDatumSpecialized_001769a0;
  (this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_prev = (_List_node_base *)&this->value;
  (this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.super__List_node_base.
  _M_next = (_List_node_base *)&this->value;
  (this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  this->needPush = false;
  this->pushed = false;
  this->stackFrame = 1;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var2[1]._M_next = inVal;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->value).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

VRDatumSpecialized(const T inVal):
    VRDatum(TID), needPush(false), pushed(false), stackFrame(1) {
    value.push_front(inVal);
  }